

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zesRasClearStateExp(zes_ras_handle_t hRas,zes_ras_error_category_exp_t category)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar7 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesRasClearStateExp(hRas, category)","");
  if (*(char *)(lVar7 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar7 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0xcc8);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar7 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar5 = lVar2 - lVar7 >> 3;
    if (lVar2 != lVar7) {
      lVar6 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar6 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x850))(plVar3,hRas,category);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0018462a;
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    lVar6 = context;
    if (((*(char *)(context + 4) != '\x01') ||
        (result = ZESHandleLifetimeValidation::zesRasClearStateExpPrologue
                            ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),hRas,
                             category), result == ZE_RESULT_SUCCESS)) &&
       (zVar4 = (*pcVar1)(hRas,category), result = zVar4, lVar2 != lVar7)) {
      lVar7 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(lVar6 + 0xd30) + lVar7 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x858))(plVar3,hRas,category,zVar4);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar7 = lVar7 + 1;
        result = zVar4;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
    }
  }
LAB_0018462a:
  logAndPropagateResult("zesRasClearStateExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasClearStateExp(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        zes_ras_error_category_exp_t category           ///< [in] category for which error counter is to be cleared.
        )
    {
        context.logger->log_trace("zesRasClearStateExp(hRas, category)");

        auto pfnClearStateExp = context.zesDdiTable.RasExp.pfnClearStateExp;

        if( nullptr == pfnClearStateExp )
            return logAndPropagateResult("zesRasClearStateExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesRasClearStateExpPrologue( hRas, category );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesRasClearStateExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesRasClearStateExpPrologue( hRas, category );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesRasClearStateExp", result);
        }

        auto driver_result = pfnClearStateExp( hRas, category );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesRasClearStateExpEpilogue( hRas, category ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesRasClearStateExp", result);
        }

        return logAndPropagateResult("zesRasClearStateExp", driver_result);
    }